

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSphereSphereCollisionAlgorithm.cpp
# Opt level: O0

void __thiscall
btSphereSphereCollisionAlgorithm::btSphereSphereCollisionAlgorithm
          (btSphereSphereCollisionAlgorithm *this,btPersistentManifold *mf,
          btCollisionAlgorithmConstructionInfo *ci,btCollisionObjectWrapper *col0Wrap,
          btCollisionObjectWrapper *col1Wrap)

{
  btCollisionObject *pbVar1;
  btCollisionObject *pbVar2;
  undefined8 uVar3;
  btCollisionObjectWrapper *in_RCX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  btCollisionObjectWrapper *in_R8;
  btCollisionObjectWrapper *in_stack_ffffffffffffff98;
  btCollisionObjectWrapper *in_stack_ffffffffffffffa0;
  btCollisionAlgorithmConstructionInfo *in_stack_ffffffffffffffa8;
  btActivatingCollisionAlgorithm *in_stack_ffffffffffffffb0;
  long *plVar4;
  
  btActivatingCollisionAlgorithm::btActivatingCollisionAlgorithm
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
             in_stack_ffffffffffffff98);
  *in_RDI = &PTR__btSphereSphereCollisionAlgorithm_002e3a08;
  *(undefined1 *)(in_RDI + 2) = 0;
  in_RDI[3] = in_RSI;
  if (in_RDI[3] == 0) {
    plVar4 = (long *)in_RDI[1];
    pbVar1 = btCollisionObjectWrapper::getCollisionObject(in_RCX);
    pbVar2 = btCollisionObjectWrapper::getCollisionObject(in_R8);
    uVar3 = (**(code **)(*plVar4 + 0x18))(plVar4,pbVar1,pbVar2);
    in_RDI[3] = uVar3;
    *(undefined1 *)(in_RDI + 2) = 1;
  }
  return;
}

Assistant:

btSphereSphereCollisionAlgorithm::btSphereSphereCollisionAlgorithm(btPersistentManifold* mf,const btCollisionAlgorithmConstructionInfo& ci,const btCollisionObjectWrapper* col0Wrap,const btCollisionObjectWrapper* col1Wrap)
: btActivatingCollisionAlgorithm(ci,col0Wrap,col1Wrap),
m_ownManifold(false),
m_manifoldPtr(mf)
{
	if (!m_manifoldPtr)
	{
		m_manifoldPtr = m_dispatcher->getNewManifold(col0Wrap->getCollisionObject(),col1Wrap->getCollisionObject());
		m_ownManifold = true;
	}
}